

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

void * flatcc_builder_finalize_aligned_buffer(flatcc_builder_t *B,size_t *size_out)

{
  size_t sVar1;
  void *buffer;
  void *pvVar2;
  ulong alignment;
  ulong size;
  
  sVar1 = (long)B->emit_end - (long)B->emit_start;
  if (size_out != (size_t *)0x0) {
    *size_out = sVar1;
  }
  alignment = (ulong)B->min_align;
  size = -alignment & (sVar1 + alignment) - 1;
  buffer = __portable_aligned_alloc(alignment,size);
  if (buffer != (void *)0x0) {
    pvVar2 = flatcc_builder_copy_buffer(B,buffer,size);
    if (pvVar2 != (void *)0x0) {
      return buffer;
    }
    free(buffer);
  }
  if (size_out != (size_t *)0x0) {
    *size_out = 0;
  }
  return (void *)0x0;
}

Assistant:

void *flatcc_builder_finalize_aligned_buffer(flatcc_builder_t *B, size_t *size_out)
{
    void * buffer;
    size_t align;
    size_t size;

    size = flatcc_builder_get_buffer_size(B);

    if (size_out) {
        *size_out = size;
    }
    align = flatcc_builder_get_buffer_alignment(B);

    size = (size + align - 1) & ~(align - 1);
    buffer = FLATCC_BUILDER_ALIGNED_ALLOC(align, size);

    if (!buffer) {
        goto done;
    }
    if (!flatcc_builder_copy_buffer(B, buffer, size)) {
        FLATCC_BUILDER_ALIGNED_FREE(buffer);
        buffer = 0;
        goto done;
    }
done:
    if (!buffer && size_out) {
        *size_out = 0;
    }
    return buffer;
}